

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  size_type __len1;
  int iVar1;
  size_t __len2;
  string logPath;
  Server myHTTPServer;
  EventLoop mainLoop;
  int local_1088;
  int local_1084;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  Server local_1040;
  Logger local_1008;
  
  local_1080._M_dataplus._M_p = (pointer)&local_1080.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1080,"./WebServer.log","");
  local_1084 = 4;
  local_1088 = 0x1f98;
  do {
    while( true ) {
      while (iVar1 = getopt(argc,argv,"t:l:p"), __len1 = local_1080._M_string_length, __s = _optarg,
            0x6f < iVar1) {
        if (iVar1 == 0x70) {
          local_1088 = atoi(_optarg);
        }
        else if (iVar1 == 0x74) {
          local_1084 = atoi(_optarg);
        }
      }
      if (iVar1 == 0x6c) break;
      if (iVar1 == -1) {
        local_1060._M_dataplus._M_p = (pointer)&local_1060.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1060,local_1080._M_dataplus._M_p,
                   local_1080._M_dataplus._M_p + local_1080._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&Logger::logFileName__abi_cxx11_,&local_1060);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1060._M_dataplus._M_p != &local_1060.field_2) {
          operator_delete(local_1060._M_dataplus._M_p,local_1060.field_2._M_allocated_capacity + 1);
        }
        Logger::Logger(&local_1008,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/Main.cpp"
                       ,0x2a);
        if (8 < ((int)&local_1008 + 0xfa8) - (int)local_1008.impl_.stream_.buffer_.cur_) {
          builtin_strncpy(local_1008.impl_.stream_.buffer_.cur_,"_PTHREAD",8);
          local_1008.impl_.stream_.buffer_.cur_ = local_1008.impl_.stream_.buffer_.cur_ + 8;
        }
        Logger::~Logger(&local_1008);
        EventLoop::EventLoop((EventLoop *)&local_1008);
        Server::Server(&local_1040,(EventLoop *)&local_1008,local_1084,local_1088);
        Server::start(&local_1040);
        EventLoop::loop((EventLoop *)&local_1008);
        Server::~Server(&local_1040);
        EventLoop::~EventLoop((EventLoop *)&local_1008);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1080._M_dataplus._M_p != &local_1080.field_2) {
          operator_delete(local_1080._M_dataplus._M_p,local_1080.field_2._M_allocated_capacity + 1);
        }
        return 0;
      }
    }
    __len2 = strlen(_optarg);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_1080,0,__len1,__s,__len2);
  } while ((1 < local_1080._M_string_length) && (*_optarg == '/'));
  puts("logPath should start with \"/\"");
  abort();
}

Assistant:

int main(int argc, char* argv[]){
    int threadNum = 4;
    int port = 8088;
    std::string logPath = "./WebServer.log";

    // parse args
    int opt;
    const char* str = "t:l:p";
    while((opt = getopt(argc, argv, str))!=-1){
        switch (opt)
        {
        case 't':{
            threadNum = atoi(optarg);
            break;
        } 
        case 'l':{
            logPath = optarg;
            if(logPath.size() <2 || optarg[0]!= '/'){   // 这要求路径开始必须为：""/"  
                printf("logPath should start with \"/\"\n");
                abort();
            }
            break;
        }
        case 'p':{
            port = atoi(optarg);
            break;
        }
        default:
            break;
        }
    }
    Logger::setLogFileName(logPath);

    // STL库在多线程上使用
#ifndef _PTHREADS
    LOG<<"_PTHREADS is not defined!";
#endif
    EventLoop mainLoop;
    Server myHTTPServer(&mainLoop, threadNum, port);
    myHTTPServer.start();
    mainLoop.loop();
    
    return 0;
}